

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocker.cc
# Opt level: O0

void __thiscall
webrtc::Blocker::Blocker
          (Blocker *this,size_t chunk_size,size_t block_size,size_t num_input_channels,
          size_t num_output_channels,float *window,size_t shift_amount,BlockerCallback *callback)

{
  size_t sVar1;
  undefined1 auVar2 [16];
  size_t sVar3;
  ulong uVar4;
  float *__p;
  pointer __dest;
  FatalMessage local_348;
  string *local_1d0;
  string *_result_1;
  string *local_50;
  string *_result;
  float *local_38;
  float *window_local;
  size_t num_output_channels_local;
  size_t num_input_channels_local;
  size_t block_size_local;
  size_t chunk_size_local;
  Blocker *this_local;
  
  this->chunk_size_ = chunk_size;
  this->block_size_ = block_size;
  this->num_input_channels_ = num_input_channels;
  this->num_output_channels_ = num_output_channels;
  sVar1 = this->block_size_;
  local_38 = window;
  window_local = (float *)num_output_channels;
  num_output_channels_local = num_input_channels;
  num_input_channels_local = block_size;
  block_size_local = chunk_size;
  chunk_size_local = (size_t)this;
  sVar3 = anon_unknown.dwarf_3b8dc::gcd(chunk_size,shift_amount);
  this->initial_delay_ = sVar1 - sVar3;
  this->frame_offset_ = 0;
  AudioRingBuffer::AudioRingBuffer
            (&this->input_buffer_,this->num_input_channels_,this->chunk_size_ + this->initial_delay_
            );
  ChannelBuffer<float>::ChannelBuffer
            (&this->output_buffer_,this->chunk_size_ + this->initial_delay_,
             this->num_output_channels_,1);
  ChannelBuffer<float>::ChannelBuffer
            (&this->input_block_,this->block_size_,this->num_input_channels_,1);
  ChannelBuffer<float>::ChannelBuffer
            (&this->output_block_,this->block_size_,this->num_output_channels_,1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = this->block_size_;
  uVar4 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  __p = (float *)operator_new__(uVar4);
  std::unique_ptr<float[],std::default_delete<float[]>>::
  unique_ptr<float*,std::default_delete<float[]>,void,bool>
            ((unique_ptr<float[],std::default_delete<float[]>> *)&this->window_,__p);
  this->shift_amount_ = shift_amount;
  this->callback_ = callback;
  local_50 = rtc::CheckLEImpl<unsigned_long,unsigned_long>
                       (&this->num_output_channels_,&this->num_input_channels_,
                        "num_output_channels_ <= num_input_channels_");
  if (local_50 != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              ((FatalMessage *)&_result_1,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/blocker.cc"
               ,0x79,local_50);
    rtc::FatalMessage::stream((FatalMessage *)&_result_1);
    rtc::FatalMessage::~FatalMessage((FatalMessage *)&_result_1);
  }
  local_1d0 = rtc::CheckLEImpl<unsigned_long,unsigned_long>
                        (&this->shift_amount_,&this->block_size_,"shift_amount_ <= block_size_");
  if (local_1d0 != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              (&local_348,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/blocker.cc"
               ,0x7a,local_1d0);
    rtc::FatalMessage::stream(&local_348);
    rtc::FatalMessage::~FatalMessage(&local_348);
  }
  __dest = std::unique_ptr<float[],_std::default_delete<float[]>_>::get(&this->window_);
  memcpy(__dest,local_38,this->block_size_ << 2);
  AudioRingBuffer::MoveReadPositionBackward(&this->input_buffer_,this->initial_delay_);
  return;
}

Assistant:

Blocker::Blocker(size_t chunk_size,
                 size_t block_size,
                 size_t num_input_channels,
                 size_t num_output_channels,
                 const float* window,
                 size_t shift_amount,
                 BlockerCallback* callback)
    : chunk_size_(chunk_size),
      block_size_(block_size),
      num_input_channels_(num_input_channels),
      num_output_channels_(num_output_channels),
      initial_delay_(block_size_ - gcd(chunk_size, shift_amount)),
      frame_offset_(0),
      input_buffer_(num_input_channels_, chunk_size_ + initial_delay_),
      output_buffer_(chunk_size_ + initial_delay_, num_output_channels_),
      input_block_(block_size_, num_input_channels_),
      output_block_(block_size_, num_output_channels_),
      window_(new float[block_size_]),
      shift_amount_(shift_amount),
      callback_(callback) {
  RTC_CHECK_LE(num_output_channels_, num_input_channels_);
  RTC_CHECK_LE(shift_amount_, block_size_);

  memcpy(window_.get(), window, block_size_ * sizeof(*window_.get()));
  input_buffer_.MoveReadPositionBackward(initial_delay_);
}